

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O3

void ihevc_intra_pred_luma_dc_sse42
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  UWORD8 aUVar8 [16];
  byte bVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  UWORD8 *pUVar15;
  bool bVar16;
  short sVar17;
  ulong uVar18;
  short sVar20;
  undefined1 auVar19 [16];
  ushort uVar21;
  ushort uVar22;
  ushort uVar25;
  undefined4 uVar23;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  undefined1 in_XMM1 [16];
  ushort uVar37;
  undefined1 auVar24 [16];
  ushort uVar38;
  undefined1 auVar39 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  
  aUVar8 = IHEVCE_SHUFFLEMASK4;
  uVar11 = nt << 0x1e | nt - 4U >> 2;
  bVar9 = 6;
  if (uVar11 < 4) {
    bVar9 = (byte)*(undefined4 *)(&DAT_00174170 + (ulong)uVar11 * 4);
  }
  uVar6 = nt * 2;
  uVar11 = nt * 3;
  if (nt == 0x20) {
    auVar39 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x20),(undefined1  [16])0x0);
    auVar40 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x30),(undefined1  [16])0x0);
    auVar41 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x40),(undefined1  [16])0x0);
    auVar43 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x50),(undefined1  [16])0x0);
    auVar44._0_2_ = auVar43._0_2_ + auVar41._0_2_ + auVar40._0_2_ + auVar39._0_2_;
    auVar44._2_2_ = auVar43._2_2_ + auVar41._2_2_ + auVar40._2_2_ + auVar39._2_2_;
    auVar44._4_2_ = auVar43._4_2_ + auVar41._4_2_ + auVar40._4_2_ + auVar39._4_2_;
    auVar44._6_2_ = auVar43._6_2_ + auVar41._6_2_ + auVar40._6_2_ + auVar39._6_2_;
    auVar44._8_2_ = auVar43._8_2_ + auVar41._8_2_ + auVar40._8_2_ + auVar39._8_2_;
    auVar44._10_2_ = auVar43._10_2_ + auVar41._10_2_ + auVar40._10_2_ + auVar39._10_2_;
    auVar44._12_2_ = auVar43._12_2_ + auVar41._12_2_ + auVar40._12_2_ + auVar39._12_2_;
    auVar44._14_2_ = auVar43._14_2_ + auVar41._14_2_ + auVar40._14_2_ + auVar39._14_2_;
    auVar39 = pshufb(auVar44,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar39 = phaddw(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar39 = pshufb(ZEXT416((uint)((int)((((uint)pu1_ref[uVar11] + auVar39._0_4_) -
                                          (uint)pu1_ref[uVar6]) + 0x20) >> (bVar9 & 0x1f))),
                     (undefined1  [16])0x0);
    bVar16 = true;
    do {
      bVar7 = bVar16;
      *(undefined1 (*) [16])pu1_dst = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 2) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 3) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 4) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 5) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 6) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 7) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 8) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 9) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 10) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xb) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xc) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xd) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xe) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])pu1_dst + dst_strd * 0xf) = auVar39;
      *(undefined1 (*) [16])((long)pu1_dst + 0x10) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 2) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 3) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 4) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 5) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 6) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 7) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 8) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 9) = auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 10) = auVar39
      ;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xb) =
           auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xc) =
           auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xd) =
           auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xe) =
           auVar39;
      *(undefined1 (*) [16])(*(undefined1 (*) [16])((long)pu1_dst + 0x10) + dst_strd * 0xf) =
           auVar39;
      pu1_dst = *(undefined1 (*) [16])pu1_dst + dst_strd * 0x10;
      bVar16 = false;
    } while (bVar7);
  }
  else if (nt == 0x10) {
    auVar39 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x10),(undefined1  [16])0x0);
    auVar40 = psadbw(*(undefined1 (*) [16])(pu1_ref + 0x20),(undefined1  [16])0x0);
    auVar41._0_2_ = auVar40._0_2_ + auVar39._0_2_;
    auVar41._2_2_ = auVar40._2_2_ + auVar39._2_2_;
    auVar41._4_2_ = auVar40._4_2_ + auVar39._4_2_;
    auVar41._6_2_ = auVar40._6_2_ + auVar39._6_2_;
    auVar41._8_2_ = auVar40._8_2_ + auVar39._8_2_;
    auVar41._10_2_ = auVar40._10_2_ + auVar39._10_2_;
    auVar41._12_2_ = auVar40._12_2_ + auVar39._12_2_;
    auVar41._14_2_ = auVar40._14_2_ + auVar39._14_2_;
    auVar40 = pmovzxbw(auVar39,*(undefined8 *)(pu1_ref + (ulong)uVar6 + 1));
    auVar39 = pshufb(auVar41,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar39 = phaddw(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    uVar14 = (int)((((uint)pu1_ref[uVar11] + auVar39._0_4_) - (uint)pu1_ref[uVar6]) + 0x10) >>
             (bVar9 & 0x1f);
    auVar39 = pmovzxbw((undefined1  [16])IHEVCE_SHUFFLEMASK5,
                       *(undefined8 *)(pu1_ref + (ulong)uVar6 + 9));
    uVar11 = uVar14 * 3 + 2;
    auVar41 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
    sVar17 = auVar41._0_2_;
    sVar20 = auVar41._2_2_;
    uVar22 = (ushort)(auVar40._0_2_ + sVar17) >> 2;
    uVar26 = (ushort)(auVar40._2_2_ + sVar20) >> 2;
    uVar28 = (ushort)(auVar40._4_2_ + sVar17) >> 2;
    uVar30 = (ushort)(auVar40._6_2_ + sVar20) >> 2;
    uVar32 = (ushort)(auVar40._8_2_ + sVar17) >> 2;
    uVar34 = (ushort)(auVar40._10_2_ + sVar20) >> 2;
    uVar36 = (ushort)(auVar40._12_2_ + sVar17) >> 2;
    uVar38 = (ushort)(auVar40._14_2_ + sVar20) >> 2;
    uVar21 = (ushort)(auVar39._0_2_ + sVar17) >> 2;
    uVar25 = (ushort)(auVar39._2_2_ + sVar20) >> 2;
    uVar27 = (ushort)(auVar39._4_2_ + sVar17) >> 2;
    uVar29 = (ushort)(auVar39._6_2_ + sVar20) >> 2;
    uVar31 = (ushort)(auVar39._8_2_ + sVar17) >> 2;
    uVar33 = (ushort)(auVar39._10_2_ + sVar20) >> 2;
    uVar35 = (ushort)(auVar39._12_2_ + sVar17) >> 2;
    uVar37 = (ushort)(auVar39._14_2_ + sVar20) >> 2;
    *pu1_dst = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    pu1_dst[1] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    pu1_dst[2] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
    pu1_dst[3] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
    pu1_dst[4] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
    pu1_dst[5] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
    pu1_dst[6] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
    pu1_dst[7] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
    pu1_dst[8] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    pu1_dst[9] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    pu1_dst[10] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
    pu1_dst[0xb] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
    pu1_dst[0xc] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
    pu1_dst[0xd] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
    pu1_dst[0xe] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
    pu1_dst[0xf] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar6 - 1] + uVar14 * 2 + (uint)pu1_ref[0x21] + 2 >> 2);
    lVar10 = (long)dst_strd;
    pUVar15 = pu1_dst + lVar10;
    lVar12 = 0xf;
    do {
      *pUVar15 = (UWORD8)(pu1_ref[lVar12 + ((ulong)(uVar6 - 2) - 0xf)] + uVar11 >> 2);
      pUVar15 = pUVar15 + lVar10;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    auVar19 = pshufb(ZEXT416(uVar14),(undefined1  [16])0x0);
    uVar11 = 0xfffffff9;
    auVar39 = auVar19;
    auVar40 = auVar19;
    auVar43 = auVar19;
    auVar42 = auVar19;
    auVar45 = auVar19;
    auVar46 = auVar19;
    do {
      uVar18 = auVar19._0_8_;
      bVar9 = pu1_dst[lVar10 * 2];
      bVar1 = pu1_dst[lVar10 * 3];
      bVar2 = pu1_dst[lVar10 * 4];
      bVar3 = pu1_dst[lVar10 * 5];
      bVar4 = pu1_dst[lVar10 * 6];
      bVar5 = pu1_dst[lVar10 * 7];
      *(ulong *)(pu1_dst + lVar10) = uVar18 & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10];
      *(ulong *)((long)(pu1_dst + lVar10) + 8) = auVar19._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 2) = auVar46._0_8_ & 0xffffffffffffff00 | (ulong)bVar9;
      *(ulong *)((long)(pu1_dst + lVar10 * 2) + 8) = auVar46._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 3) = auVar40._0_8_ & 0xffffffffffffff00 | (ulong)bVar1;
      *(ulong *)((long)(pu1_dst + lVar10 * 3) + 8) = auVar40._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 4) = auVar43._0_8_ & 0xffffffffffffff00 | (ulong)bVar2;
      *(ulong *)((long)(pu1_dst + lVar10 * 4) + 8) = auVar43._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 5) = auVar42._0_8_ & 0xffffffffffffff00 | (ulong)bVar3;
      *(ulong *)((long)(pu1_dst + lVar10 * 5) + 8) = auVar42._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 6) = auVar45._0_8_ & 0xffffffffffffff00 | (ulong)bVar4;
      *(ulong *)((long)(pu1_dst + lVar10 * 6) + 8) = auVar45._8_8_;
      *(ulong *)(pu1_dst + lVar10 * 7) = auVar39._0_8_ & 0xffffffffffffff00 | (ulong)bVar5;
      *(ulong *)((long)(pu1_dst + lVar10 * 7) + 8) = auVar39._8_8_;
      auVar46._0_8_ = auVar46._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 9];
      auVar40._0_8_ = auVar40._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 10];
      auVar43._0_8_ = auVar43._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 0xb];
      auVar42._0_8_ = auVar42._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 0xc];
      auVar45._0_8_ = auVar45._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 0xd];
      auVar39._0_8_ = auVar39._0_8_ & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 0xe];
      *(ulong *)(pu1_dst + lVar10 * 8) = uVar18 & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 8];
      *(ulong *)((long)(pu1_dst + lVar10 * 8) + 8) = auVar19._8_8_;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 9) = auVar46;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 10) = auVar40;
      auVar19._0_8_ = uVar18 & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10 * 0xf];
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 0xb) = auVar43;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 0xc) = auVar42;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 0xd) = auVar45;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 0xe) = auVar39;
      *(undefined1 (*) [16])(pu1_dst + lVar10 * 0xf) = auVar19;
      bVar16 = 0xfffffff7 < uVar11;
      uVar11 = uVar11 + 8;
    } while (bVar16);
  }
  else if (nt == 8) {
    auVar39 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])(pu1_ref + 8));
    auVar39 = pshufb(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar39 = phaddw(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    uVar14 = (int)((((uint)pu1_ref[uVar11] + auVar39._0_4_) - (uint)pu1_ref[uVar6]) + 8) >>
             (bVar9 & 0x1f);
    uVar11 = uVar14 * 3 + 2;
    auVar39 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
    auVar40 = pmovzxbw(*(undefined1 (*) [16])(pu1_ref + 8),
                       *(undefined8 *)(pu1_ref + (ulong)uVar6 + 1));
    sVar17 = auVar39._0_2_;
    sVar20 = auVar39._2_2_;
    uVar21 = (ushort)(auVar40._0_2_ + sVar17) >> 2;
    uVar25 = (ushort)(auVar40._2_2_ + sVar20) >> 2;
    uVar27 = (ushort)(auVar40._4_2_ + sVar17) >> 2;
    uVar29 = (ushort)(auVar40._6_2_ + sVar20) >> 2;
    uVar31 = (ushort)(auVar40._8_2_ + sVar17) >> 2;
    uVar33 = (ushort)(auVar40._10_2_ + sVar20) >> 2;
    uVar35 = (ushort)(auVar40._12_2_ + sVar17) >> 2;
    uVar37 = (ushort)(auVar40._14_2_ + sVar20) >> 2;
    *(ulong *)pu1_dst =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                    (0xff < uVar33),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 -
                                             (0xff < uVar31),
                                             CONCAT13((uVar29 != 0) * (uVar29 < 0x100) *
                                                      (char)uVar29 - (0xff < uVar29),
                                                      CONCAT12((uVar27 != 0) * (uVar27 < 0x100) *
                                                               (char)uVar27 - (0xff < uVar27),
                                                               CONCAT11((uVar25 != 0) *
                                                                        (uVar25 < 0x100) *
                                                                        (char)uVar25 -
                                                                        (0xff < uVar25),
                                                                        (uVar21 != 0) *
                                                                        (uVar21 < 0x100) *
                                                                        (char)uVar21 -
                                                                        (0xff < uVar21))))))));
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar6 - 1] + uVar14 * 2 + (uint)pu1_ref[0x11] + 2 >> 2);
    lVar10 = (long)dst_strd;
    pUVar15 = pu1_dst + lVar10;
    lVar12 = 7;
    do {
      *pUVar15 = (UWORD8)(pu1_ref[lVar12 + ((ulong)(uVar6 - 2) - 7)] + uVar11 >> 2);
      pUVar15 = pUVar15 + lVar10;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    auVar39 = pshufb(ZEXT416(uVar14),(undefined1  [16])0x0);
    uVar18 = auVar39._0_8_;
    bVar9 = pu1_dst[lVar10 * 2];
    bVar1 = pu1_dst[lVar10 * 3];
    bVar2 = pu1_dst[lVar10 * 4];
    bVar3 = pu1_dst[lVar10 * 5];
    bVar4 = pu1_dst[lVar10 * 6];
    bVar5 = pu1_dst[lVar10 * 7];
    *(ulong *)(pu1_dst + lVar10) = uVar18 & 0xffffffffffffff00 | (ulong)pu1_dst[lVar10];
    *(ulong *)(pu1_dst + lVar10 * 2) = uVar18 & 0xffffffffffffff00 | (ulong)bVar9;
    *(ulong *)(pu1_dst + lVar10 * 3) = uVar18 & 0xffffffffffffff00 | (ulong)bVar1;
    *(ulong *)(pu1_dst + lVar10 * 4) = uVar18 & 0xffffffffffffff00 | (ulong)bVar2;
    *(ulong *)(pu1_dst + lVar10 * 5) = uVar18 & 0xffffffffffffff00 | (ulong)bVar3;
    *(ulong *)(pu1_dst + lVar10 * 6) = uVar18 & 0xffffffffffffff00 | (ulong)bVar4;
    *(ulong *)(pu1_dst + lVar10 * 7) = uVar18 & 0xffffffffffffff00 | (ulong)bVar5;
  }
  else if (nt == 4) {
    auVar39 = pmovzxbw(in_XMM1,*(undefined8 *)(pu1_ref + 4));
    auVar40 = pmovzxbw(in_XMM3,*(undefined8 *)(pu1_ref + (ulong)uVar6 + 1));
    auVar39 = phaddw(auVar39,(undefined1  [16])0x0);
    auVar39 = phaddw(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    auVar39 = phaddw(auVar39,(undefined1  [16])IHEVCE_SHUFFLEMASK5);
    iVar13 = (int)((((uint)pu1_ref[uVar11] + auVar39._0_4_) - (uint)pu1_ref[uVar6]) + 4) >>
             (bVar9 & 0x1f);
    uVar11 = iVar13 * 3 + 2;
    auVar39 = pshuflw(ZEXT416(uVar11),ZEXT416(uVar11),0);
    sVar17 = auVar39._0_2_;
    sVar20 = auVar39._2_2_;
    uVar21 = (ushort)(sVar17 + auVar40._0_2_) >> 2;
    uVar25 = (ushort)(sVar20 + auVar40._2_2_) >> 2;
    uVar27 = (ushort)(sVar17 + auVar40._4_2_) >> 2;
    uVar29 = (ushort)(sVar20 + auVar40._6_2_) >> 2;
    uVar31 = (ushort)(sVar17 + auVar40._8_2_) >> 2;
    uVar33 = (ushort)(sVar20 + auVar40._10_2_) >> 2;
    uVar35 = (ushort)(sVar17 + auVar40._12_2_) >> 2;
    uVar37 = (ushort)(sVar20 + auVar40._14_2_) >> 2;
    uVar23 = CONCAT13((uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29),
                      CONCAT12((uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27),
                               CONCAT11((uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 -
                                        (0xff < uVar25),
                                        (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 -
                                        (0xff < uVar21))));
    *(undefined4 *)pu1_dst = uVar23;
    *pu1_dst = (UWORD8)((uint)pu1_ref[uVar6 - 1] + iVar13 * 2 + (uint)pu1_ref[9] + 2 >> 2);
    lVar10 = (long)dst_strd;
    pUVar15 = pu1_dst + lVar10;
    lVar12 = 3;
    do {
      *pUVar15 = (UWORD8)(pu1_ref[lVar12 + ((ulong)(uVar6 - 2) - 3)] + uVar11 >> 2);
      pUVar15 = pUVar15 + lVar10;
      lVar12 = lVar12 + -1;
    } while (lVar12 != 0);
    auVar24._8_8_ = 0;
    auVar24._0_8_ =
         CONCAT17((uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37),
                  CONCAT16((uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35),
                           CONCAT15((uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 -
                                    (0xff < uVar33),
                                    CONCAT14((uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 -
                                             (0xff < uVar31),uVar23)))) & 0xffffffffffffff00 |
         (ulong)(byte)iVar13;
    auVar39 = pshufb(auVar24,(undefined1  [16])aUVar8);
    auVar40 = pshufb(auVar39,(undefined1  [16])aUVar8);
    bVar9 = pu1_dst[lVar10 * 2];
    bVar1 = pu1_dst[lVar10 * 3];
    *(uint *)(pu1_dst + lVar10) = auVar39._0_4_ & 0xffffff00 | (uint)pu1_dst[lVar10];
    *(uint *)(pu1_dst + lVar10 * 2) = auVar40._0_4_ & 0xffffff00 | (uint)bVar9;
    *(uint *)(pu1_dst + lVar10 * 3) = auVar40._0_4_ & 0xffffff00 | (uint)bVar1;
  }
  return;
}

Assistant:

void ihevc_intra_pred_luma_dc_sse42(UWORD8 *pu1_ref,
                                    WORD32 src_strd,
                                    UWORD8 *pu1_dst,
                                    WORD32 dst_strd,
                                    WORD32 nt,
                                    WORD32 mode)
{

    WORD32 acc_dc;
    WORD32 dc_val, two_dc_val, three_dc_val;
    WORD32 row;
    WORD32 log2nt = 5;
    WORD32 two_nt, three_nt;
    __m128i src_temp1, src_temp7, src_temp3, src_temp4, src_temp5, src_temp6;
    __m128i src_temp8, src_temp9, src_temp10, src_temp2;
    __m128i m_zero = _mm_set1_epi32(0);
    __m128i sm = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK5[0]);
    UNUSED(src_strd);
    UNUSED(mode);


    switch(nt)
    {
        case 32:
            log2nt = 5;
            break;
        case 16:
            log2nt = 4;
            break;
        case 8:
            log2nt = 3;
            break;
        case 4:
            log2nt = 2;
            break;
        default:
            break;
    }
    two_nt = 2 * nt;
    three_nt = 3 * nt;

    acc_dc = 0;
    /* Calculate DC value for the transform block */



    if(nt == 32)
    {
        __m128i temp;
        WORD32 itr_count;

        src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
        src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
        src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
        src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

        src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
        src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
        src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
        src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

        src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
        src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
        src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

        src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
        src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

        acc_dc = _mm_cvtsi128_si32(src_temp4);

        acc_dc += pu1_ref[three_nt];
        acc_dc -= pu1_ref[two_nt];

        /* computing acc_dc value */
        dc_val = (acc_dc + nt) >> (log2nt + 1);

        two_dc_val = 2 * dc_val;
        three_dc_val = 3 * dc_val;

        temp = _mm_set1_epi8(dc_val);

        for(itr_count = 0; itr_count < 2; itr_count++)
        {
            /*  pu1_dst[(row * dst_strd) + col] = dc_val;*/
            _mm_storeu_si128((__m128i *)(pu1_dst + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((0) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((1) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((2) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((3) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((4) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((5) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((6) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((7) * dst_strd)), temp);

            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((8) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((9) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((10) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((11) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((12) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((13) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((14) * dst_strd)), temp);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16 + ((15) * dst_strd)), temp);

            pu1_dst += 16 * dst_strd;
        }
    }

    else

    {
        __m128i  zero_8x16b;
        __m128i sm1 = _mm_loadu_si128((__m128i *)&IHEVCE_SHUFFLEMASK4[0]);

        /* DC filtering for the first top row and first left column */

        zero_8x16b = _mm_set1_epi16(0);

        if(nt == 4) /* nt multiple of 4*/
        {
            WORD32 temp1, temp2, temp3;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp2 =  _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));

            src_temp4 =  _mm_cvtepu8_epi16(src_temp3);
            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);

            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);
            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

/* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2) >> 2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, zero_8x16b);

            temp1 = _mm_cvtsi128_si32(src_temp2);

            *(WORD32 *)(&pu1_dst[0]) = temp1;

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

            src_temp2 = _mm_insert_epi8(src_temp2, dc_val, 0);

            src_temp2 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp3 =  _mm_shuffle_epi8(src_temp2, sm1);
            src_temp4 =  _mm_shuffle_epi8(src_temp2, sm1);

            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[(1 * dst_strd) + 0], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[(2 * dst_strd) + 0], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[(3 * dst_strd) + 0], 0);

            temp1 = _mm_cvtsi128_si32(src_temp2);
            temp2 = _mm_cvtsi128_si32(src_temp3);
            temp3 = _mm_cvtsi128_si32(src_temp4);

            *(WORD32 *)(&pu1_dst[(1 * dst_strd)]) = temp1;
            *(WORD32 *)(&pu1_dst[(2 * dst_strd)]) = temp2;
            *(WORD32 *)(&pu1_dst[(3 * dst_strd)]) = temp3;

        }
        else if(nt == 8) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));

            src_temp4 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp2 = _mm_packus_epi16(src_temp2, zero_8x16b);

            _mm_storel_epi64((__m128i *)(pu1_dst), src_temp2);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;

            /* Fill the remaining rows with DC value*/

            src_temp1 = _mm_set1_epi8(dc_val);
            src_temp2 = _mm_set1_epi8(dc_val);
            src_temp3 = _mm_set1_epi8(dc_val);
            src_temp4 = _mm_set1_epi8(dc_val);
            src_temp5 = _mm_set1_epi8(dc_val);
            src_temp6 = _mm_set1_epi8(dc_val);
            src_temp7 = _mm_set1_epi8(dc_val);

            src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
            src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
            src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
            src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
            src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
            src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
            src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

            _mm_storel_epi64((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
            _mm_storel_epi64((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

        }
        else if(nt == 16) /* if nt%8==0*/
        {

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));

            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);

            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
            src_temp10 =  _mm_cvtepu8_epi16(src_temp10);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp10 = _mm_add_epi16(src_temp10, src_temp1);
            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;
            /* Fill the remaining rows with DC value*/
            src_temp1 =  _mm_set1_epi8(dc_val);
            src_temp2 =  _mm_set1_epi8(dc_val);
            src_temp3 =  _mm_set1_epi8(dc_val);
            src_temp4 =  _mm_set1_epi8(dc_val);
            src_temp5 =  _mm_set1_epi8(dc_val);
            src_temp6 =  _mm_set1_epi8(dc_val);
            src_temp7 =  _mm_set1_epi8(dc_val);

            for(row = 1; row < nt; row += 8)
            {

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((1) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((2) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((3) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((4) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((5) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((6) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((7) * dst_strd)), src_temp7);

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((8) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((9) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((10) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((11) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((12) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((13) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((14) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((8) * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((9) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((10) * dst_strd)), src_temp3);

                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((15) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((11) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((12) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((13) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((14) * dst_strd)), src_temp7);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((15) * dst_strd)), src_temp1);

            }

        }
        else if(nt == 32) /* if nt%8==0*/
        {

            __m128i src_temp11, src_temp12, src_temp13, src_temp14, src_temp15, src_temp16, src_temp17;

            src_temp3 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt));
            src_temp4 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 16));
            src_temp7 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 32));
            src_temp8 =  _mm_loadu_si128((__m128i *)(pu1_ref + nt + 48));

            /* loding 8-bit 16 pixel */
            src_temp2 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1));
            src_temp6 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 8));
            src_temp9 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 16));
            src_temp10 = _mm_loadu_si128((__m128i *)(pu1_ref + two_nt + 1 + 24));

            src_temp3 = _mm_sad_epu8(src_temp3, m_zero);
            src_temp4 = _mm_sad_epu8(src_temp4, m_zero);
            src_temp7 = _mm_sad_epu8(src_temp7, m_zero);
            src_temp8 = _mm_sad_epu8(src_temp8, m_zero);

            src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
            src_temp6 =  _mm_cvtepu8_epi16(src_temp6);
            src_temp9 =  _mm_cvtepu8_epi16(src_temp9);
            src_temp10 =  _mm_cvtepu8_epi16(src_temp10);

            src_temp4 = _mm_add_epi16(src_temp3, src_temp4);
            src_temp8 = _mm_add_epi16(src_temp7, src_temp8);
            src_temp4 = _mm_add_epi16(src_temp4, src_temp8);

            src_temp4 = _mm_shuffle_epi8(src_temp4, sm);
            src_temp4 = _mm_hadd_epi16(src_temp4, m_zero);

            acc_dc = _mm_cvtsi128_si32(src_temp4);

            acc_dc += pu1_ref[three_nt];
            acc_dc -= pu1_ref[two_nt];

            /* computing acc_dc value */

            dc_val = (acc_dc + nt) >> (log2nt + 1);

            three_dc_val = 3 * dc_val;
            src_temp1 = _mm_set1_epi16(three_dc_val + 2);
            two_dc_val = 2 * dc_val;

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2 */
            src_temp2 = _mm_add_epi16(src_temp2, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp6, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp9, src_temp1);
            src_temp2 = _mm_add_epi16(src_temp10, src_temp1);

            /*(pu1_ref[two_nt + 1 + col] + three_dc_val + 2)>>2 */
            src_temp2 = _mm_srli_epi16(src_temp2, 2);
            src_temp6 = _mm_srli_epi16(src_temp6, 2);
            src_temp9 = _mm_srli_epi16(src_temp9, 2);
            src_temp10 = _mm_srli_epi16(src_temp10, 2);

            src_temp2 = _mm_packus_epi16(src_temp2, src_temp6);
            src_temp10 = _mm_packus_epi16(src_temp9, src_temp10);

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp10);

            /*  retore  first value*/
            pu1_dst[0] = ((pu1_ref[two_nt - 1] + two_dc_val + pu1_ref[two_nt + 1] + 2)
                            >> 2);

            for(row = 1; row < nt; row++)
                pu1_dst[row * dst_strd] = (pu1_ref[two_nt - 1 - row] + three_dc_val + 2)
                                >> 2;
            /* Fill the remaining rows with DC value*/
            src_temp1 = _mm_insert_epi8(src_temp1, dc_val, 0);

            src_temp2 =  src_temp1;
            src_temp3 = src_temp1;
            src_temp4 =  src_temp1;
            src_temp5 =  src_temp1;
            src_temp6 =  src_temp1;
            src_temp7 =  src_temp1;

            src_temp12 = src_temp1;
            src_temp13 = src_temp1;
            src_temp14 = src_temp1;
            src_temp15 = src_temp1;
            src_temp16 = src_temp1;
            src_temp17 = src_temp1;
            src_temp11 = src_temp1;

            for(row = 1; row < nt; row++)
            {
                src_temp1 = _mm_insert_epi8(src_temp1, pu1_dst[((1) * dst_strd)], 0);
                src_temp2 = _mm_insert_epi8(src_temp2, pu1_dst[((2) * dst_strd)], 0);
                src_temp3 = _mm_insert_epi8(src_temp3, pu1_dst[((3) * dst_strd)], 0);
                src_temp4 = _mm_insert_epi8(src_temp4, pu1_dst[((4) * dst_strd)], 0);
                src_temp5 = _mm_insert_epi8(src_temp5, pu1_dst[((5) * dst_strd)], 0);
                src_temp6 = _mm_insert_epi8(src_temp6, pu1_dst[((6) * dst_strd)], 0);
                src_temp7 = _mm_insert_epi8(src_temp7, pu1_dst[((7) * dst_strd)], 0);

                _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd)), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + (row * dst_strd) + 16), src_temp11);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd)), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 1) * dst_strd) + 16), src_temp12);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd)), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 2) * dst_strd) + 16), src_temp13);

                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd)), src_temp4);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 3) * dst_strd) + 16), src_temp14);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 4) * dst_strd)), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd) + 16), src_temp15);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd)), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 5) * dst_strd) + 16), src_temp16);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd)), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + ((row + 6) * dst_strd) + 16), src_temp17);


            }

        }
    }
}